

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

FT_Error afm_parser_parse(AFM_Parser parser)

{
  FT_Memory memory;
  AFM_FontInfo pAVar1;
  AFM_FontInfo pAVar2;
  int iVar3;
  AFM_Token AVar4;
  FT_Error FVar5;
  FT_Error FVar6;
  FT_Int FVar7;
  char *pcVar8;
  AFM_KernPair pAVar9;
  ulong uVar10;
  AFM_TrackKern pAVar11;
  uint uVar12;
  FT_Offset *in_RDX;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *pFVar13;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  FT_Offset *extraout_RDX_15;
  FT_Offset *extraout_RDX_16;
  FT_Offset *extraout_RDX_17;
  FT_Int tmp;
  FT_Int n;
  undefined4 uStack_ec;
  AFM_FontInfo local_e8;
  FT_Int metrics_sets;
  FT_Offset len;
  FT_Offset local_d0;
  FT_Offset len_1;
  anon_union_8_5_814e15a7_for_u local_c0;
  int local_b8;
  FT_UInt local_b0;
  undefined4 uStack_ac;
  int local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  int local_98;
  uint local_90;
  undefined4 uStack_8c;
  int local_88;
  FT_Fixed local_80;
  AFM_ValueRec shared_vals [4];
  
  memory = parser->memory;
  pAVar1 = parser->FontInfo;
  metrics_sets = 0;
  if (pAVar1 == (AFM_FontInfo)0x0) {
    return 6;
  }
  pcVar8 = afm_parser_next_key(parser,(FT_Bool)&len,in_RDX);
  if (pcVar8 == (char *)0x0) {
    return 2;
  }
  if (len != 0x10) {
    return 2;
  }
  iVar3 = strncmp(pcVar8,"StartFontMetrics",0x10);
  if (iVar3 != 0) {
    return 2;
  }
  FVar6 = 0xa0;
  pFVar13 = extraout_RDX;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              pcVar8 = afm_parser_next_key(parser,(FT_Bool)&len,pFVar13);
              if (pcVar8 == (char *)0x0) goto LAB_0014bc9a;
              AVar4 = afm_tokenize(pcVar8,len);
              if (AVar4 != AFM_TOKEN_ASCENDER) break;
              shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
              FVar7 = afm_parser_read_vals(parser,shared_vals,1);
              if (FVar7 != 1) goto LAB_0014bc9a;
              pAVar1->Ascender = CONCAT71(shared_vals[0].u.f._1_7_,shared_vals[0].u.b);
              pFVar13 = extraout_RDX_06;
            }
            if (AVar4 != AFM_TOKEN_DESCENDER) break;
            shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
            FVar7 = afm_parser_read_vals(parser,shared_vals,1);
            if (FVar7 != 1) goto LAB_0014bc9a;
            pAVar1->Descender = CONCAT71(shared_vals[0].u.f._1_7_,shared_vals[0].u.b);
            pFVar13 = extraout_RDX_02;
          }
          if (AVar4 != AFM_TOKEN_FONTBBOX) break;
          shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
          shared_vals[1].type = shared_vals[0].type;
          shared_vals[2].type = shared_vals[0].type;
          shared_vals[3].type = shared_vals[0].type;
          FVar7 = afm_parser_read_vals(parser,shared_vals,4);
          if (FVar7 != 4) goto LAB_0014bc9a;
          (pAVar1->FontBBox).xMin = CONCAT71(shared_vals[0].u.f._1_7_,shared_vals[0].u.b);
          (pAVar1->FontBBox).yMin = (FT_Pos)shared_vals[1].u;
          (pAVar1->FontBBox).xMax = (FT_Pos)shared_vals[2].u;
          (pAVar1->FontBBox).yMax = (FT_Pos)shared_vals[3].u;
          pFVar13 = extraout_RDX_08;
        }
        if (AVar4 != AFM_TOKEN_ISCIDFONT) break;
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        FVar7 = afm_parser_read_vals(parser,shared_vals,1);
        if (FVar7 != 1) goto LAB_0014bc9a;
        pAVar1->IsCIDFont = shared_vals[0].u.b;
        pFVar13 = extraout_RDX_01;
      }
      if (AVar4 == AFM_TOKEN_METRICSSETS) break;
      if (AVar4 == AFM_TOKEN_STARTCHARMETRICS) {
        n = 0;
        FVar5 = afm_parser_read_int(parser,&n);
        if (FVar5 != 0) goto LAB_0014bc9a;
        iVar3 = n + 1;
        pFVar13 = extraout_RDX_03;
        while (iVar3 = iVar3 + -1, 0 < iVar3) {
          pcVar8 = afm_parser_next_key(parser,'\0',pFVar13);
          pFVar13 = extraout_RDX_04;
          if (pcVar8 == (char *)0x0) {
            return 0xa0;
          }
        }
        do {
          pcVar8 = afm_parser_next_key(parser,(FT_Bool)&len_1,pFVar13);
          if (pcVar8 == (char *)0x0) {
            return 0xa0;
          }
          AVar4 = afm_tokenize(pcVar8,CONCAT44(len_1._4_4_,(int)len_1));
        } while ((AVar4 != AFM_TOKEN_ENDCHARMETRICS) &&
                (pFVar13 = extraout_RDX_05, AVar4 != AFM_TOKEN_ENDFONTMETRICS));
        FVar6 = 0;
        pFVar13 = extraout_RDX_05;
      }
      else {
        if (AVar4 == AFM_TOKEN_ENDFONTMETRICS) {
          return 0;
        }
        pFVar13 = extraout_RDX_00;
        if (AVar4 == AFM_TOKEN_STARTKERNDATA) goto LAB_0014b9b8;
      }
    }
    FVar5 = afm_parser_read_int(parser,&metrics_sets);
    if (FVar5 != 0) goto LAB_0014bc9a;
    pFVar13 = extraout_RDX_07;
  } while ((metrics_sets & 0xfffffffdU) == 0);
  FVar6 = 7;
LAB_0014bc9a:
  ft_mem_free(memory,pAVar1->TrackKerns);
  pAVar1->TrackKerns = (AFM_TrackKern)0x0;
  pAVar1->NumTrackKern = 0;
  ft_mem_free(memory,pAVar1->KernPairs);
  pAVar1->KernPairs = (AFM_KernPair)0x0;
  pAVar1->NumKernPair = 0;
  pAVar1->IsCIDFont = '\0';
  return FVar6;
LAB_0014b9b8:
  pcVar8 = afm_parser_next_key(parser,(FT_Bool)&local_d0,pFVar13);
  FVar6 = 0xa0;
  if (pcVar8 == (char *)0x0) goto LAB_0014bc9a;
  AVar4 = afm_tokenize(pcVar8,local_d0);
  if (AVar4 - AFM_TOKEN_STARTKERNPAIRS < 2) {
    pAVar2 = parser->FontInfo;
    FVar6 = afm_parser_read_int(parser,&tmp);
    if (FVar6 == 0) {
      if (-1 < tmp) {
        pAVar2->NumKernPair = tmp;
        pFVar13 = extraout_RDX_10;
        if (tmp != 0) {
          pAVar9 = (AFM_KernPair)
                   ft_mem_realloc(parser->memory,0x10,0,(ulong)(uint)tmp,(void *)0x0,
                                  (FT_Error *)&len_1);
          pAVar2->KernPairs = pAVar9;
          pFVar13 = extraout_RDX_11;
          FVar6 = (int)len_1;
          if ((int)len_1 != 0) goto LAB_0014bc9a;
        }
        iVar3 = -1;
        local_e8 = pAVar2;
        while( true ) {
          do {
            pcVar8 = afm_parser_next_key(parser,(FT_Bool)&n,pFVar13);
            if (pcVar8 == (char *)0x0) goto LAB_0014bc95;
            AVar4 = afm_tokenize(pcVar8,CONCAT44(uStack_ec,n));
            uVar10 = (ulong)(AVar4 - AFM_TOKEN_ENDFONTMETRICS);
            if (0x37 < AVar4 - AFM_TOKEN_ENDFONTMETRICS) goto LAB_0014bc95;
            pFVar13 = extraout_RDX_12;
          } while (uVar10 == 0x37);
          if ((7UL >> (uVar10 & 0x3f) & 1) != 0) break;
          if (((0x34000UL >> (uVar10 & 0x3f) & 1) == 0) ||
             (iVar3 = iVar3 + 1, (int)local_e8->NumKernPair <= iVar3)) goto LAB_0014bc95;
          pAVar9 = local_e8->KernPairs + iVar3;
          len_1._0_4_ = 5;
          local_a8 = 3;
          local_b8 = (int)len_1;
          local_98 = local_a8;
          FVar7 = afm_parser_read_vals(parser,(AFM_Value)&len_1,4);
          if (FVar7 < 3) goto LAB_0014bc95;
          pAVar9->index1 = local_c0.i;
          pAVar9->index2 = local_b0;
          pFVar13 = (FT_Offset *)0x0;
          uVar12 = local_a0;
          if (AVar4 != AFM_TOKEN_KPY) {
            uVar12 = 0;
            if (FVar7 == 4 && AVar4 == AFM_TOKEN_KP) {
              uVar12 = local_90;
            }
            pFVar13 = (FT_Offset *)(ulong)local_a0;
          }
          pAVar9->x = (FT_Int)pFVar13;
          pAVar9->y = uVar12;
        }
        local_e8->NumKernPair = iVar3 + 1U;
        qsort(local_e8->KernPairs,(ulong)(iVar3 + 1U),0x10,afm_compare_kern_pairs);
        pFVar13 = extraout_RDX_13;
        goto LAB_0014b9b8;
      }
    }
  }
  else {
    if (AVar4 != AFM_TOKEN_STARTTRACKKERN) {
      pFVar13 = extraout_RDX_09;
      if (AVar4 != AFM_TOKEN_UNKNOWN) goto LAB_0014bcd6;
      goto LAB_0014b9b8;
    }
    pAVar2 = parser->FontInfo;
    FVar6 = afm_parser_read_int(parser,&tmp);
    if (FVar6 != 0) goto LAB_0014bc95;
    if (-1 < tmp) {
      pAVar2->NumTrackKern = tmp;
      pFVar13 = extraout_RDX_14;
      if (tmp != 0) {
        pAVar11 = (AFM_TrackKern)
                  ft_mem_realloc(parser->memory,0x28,0,(ulong)(uint)tmp,(void *)0x0,
                                 (FT_Error *)&len_1);
        pAVar2->TrackKerns = pAVar11;
        pFVar13 = extraout_RDX_15;
        FVar6 = (int)len_1;
        if ((int)len_1 != 0) goto LAB_0014bc9a;
      }
      iVar3 = -1;
      local_e8 = pAVar2;
      do {
        while( true ) {
          pcVar8 = afm_parser_next_key(parser,(FT_Bool)&n,pFVar13);
          if (pcVar8 == (char *)0x0) goto LAB_0014bc95;
          AVar4 = afm_tokenize(pcVar8,CONCAT44(uStack_ec,n));
          if (AVar4 != AFM_TOKEN_TRACKKERN) break;
          iVar3 = iVar3 + 1;
          if ((int)local_e8->NumTrackKern <= iVar3) goto LAB_0014bc95;
          pAVar11 = local_e8->TrackKerns;
          len_1._0_4_ = 3;
          local_b8 = 2;
          local_a8 = local_b8;
          local_98 = local_b8;
          local_88 = local_b8;
          FVar7 = afm_parser_read_vals(parser,(AFM_Value)&len_1,5);
          if (FVar7 != 5) goto LAB_0014bc95;
          pAVar11[iVar3].degree = local_c0.i;
          pAVar11[iVar3].min_ptsize = CONCAT44(uStack_ac,local_b0);
          pAVar11[iVar3].min_kern = CONCAT44(uStack_9c,local_a0);
          pAVar11[iVar3].max_ptsize = CONCAT44(uStack_8c,local_90);
          pAVar11[iVar3].max_kern = local_80;
          pFVar13 = extraout_RDX_17;
        }
        pFVar13 = extraout_RDX_16;
      } while (AVar4 == AFM_TOKEN_UNKNOWN);
      if ((AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar4 == AFM_TOKEN_ENDTRACKKERN)) {
        local_e8->NumTrackKern = iVar3 + 1;
        goto LAB_0014b9b8;
      }
    }
  }
LAB_0014bc95:
  FVar6 = 0xa0;
  goto LAB_0014bc9a;
LAB_0014bcd6:
  if (AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) {
    return 0;
  }
  goto LAB_0014bc9a;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }